

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O2

void __thiscall thread_pool::ThreadPool::ThreadPool(ThreadPool *this,size_t num_threads)

{
  size_t local_48;
  anon_class_16_2_fd512dd6_for__M_head_impl local_40;
  
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->thread_map_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->thread_map_)._M_h._M_bucket_count = 0;
  (this->thread_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->thread_map_)._M_h._M_element_count = 0;
  *(undefined8 *)&(this->thread_map_)._M_h._M_rehash_policy = 0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->thread_map_)._M_h._M_buckets = &(this->thread_map_)._M_h._M_single_bucket;
  (this->thread_map_)._M_h._M_bucket_count = 1;
  (this->thread_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->thread_map_)._M_h._M_element_count = 0;
  (this->thread_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->thread_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->thread_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>::
  vector(&this->queues_,num_threads + (num_threads == 0),(allocator_type *)&local_40);
  (this->task_id_).super___atomic_base<unsigned_long>._M_i = 0;
  for (local_48 = 0;
      local_48 !=
      ((long)(this->queues_).
             super__Vector_base<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
             ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->queues_).
            super__Vector_base<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
            ._M_impl.super__Vector_impl_data._M_start) / 0xb0; local_48 = local_48 + 1) {
    local_40.this = this;
    local_40.i = local_48;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<thread_pool::ThreadPool::ThreadPool(unsigned_long)::_lambda()_1_>
              ((vector<std::thread,std::allocator<std::thread>> *)this,&local_40);
    local_40.this =
         (ThreadPool *)
         (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
         super__Vector_impl_data._M_finish[-1]._M_id._M_thread;
    std::
    _Hashtable<std::thread::id,std::pair<std::thread::id_const,unsigned_long>,std::allocator<std::pair<std::thread::id_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::thread::id>,std::hash<std::thread::id>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::thread::id,unsigned_long&>
              ((_Hashtable<std::thread::id,std::pair<std::thread::id_const,unsigned_long>,std::allocator<std::pair<std::thread::id_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::thread::id>,std::hash<std::thread::id>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->thread_map_,&local_40,&local_48);
  }
  return;
}

Assistant:

explicit ThreadPool(
      std::size_t num_threads = std::thread::hardware_concurrency())
      : threads_(),
        thread_map_(),
        queues_(std::max(1UL, num_threads)),
        task_id_(0) {
    for (std::size_t i = 0; i != queues_.size(); ++i) {
      threads_.emplace_back([this, i] () -> void { Task(i); });
      thread_map_.emplace(threads_.back().get_id(), i);
    }
  }